

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
::
nosize_unchecked_emplace_at<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>&&,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_&&,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_&&>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  size_t *psVar3;
  value_type_pointer ppVar4;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  *ptVar5;
  tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  *ptVar6;
  uint uVar7;
  ushort uVar8;
  char *pcVar9;
  ulong uVar10;
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
  *ppVar11;
  long lVar12;
  ulong uVar13;
  group_type_pointer pgVar14;
  undefined1 auVar15 [16];
  
  pgVar14 = __return_storage_ptr__->pg;
  uVar10 = (ulong)__return_storage_ptr__->n;
  ppVar11 = __return_storage_ptr__->p;
  lVar12 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar15[0] = -(pgVar2->m[0].n == '\0');
    auVar15[1] = -(pgVar2->m[1].n == '\0');
    auVar15[2] = -(pgVar2->m[2].n == '\0');
    auVar15[3] = -(pgVar2->m[3].n == '\0');
    auVar15[4] = -(pgVar2->m[4].n == '\0');
    auVar15[5] = -(pgVar2->m[5].n == '\0');
    auVar15[6] = -(pgVar2->m[6].n == '\0');
    auVar15[7] = -(pgVar2->m[7].n == '\0');
    auVar15[8] = -(pgVar2->m[8].n == '\0');
    auVar15[9] = -(pgVar2->m[9].n == '\0');
    auVar15[10] = -(pgVar2->m[10].n == '\0');
    auVar15[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar15[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar15[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar15[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar15[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar8 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe;
    if (uVar8 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar7 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      uVar10 = (ulong)uVar7;
      ppVar4 = arrays_->elements_;
      uVar13 = (ulong)(uVar7 << 6);
      ppVar11 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
                 *)((long)&ppVar4[pos0 * 0xf].first.
                           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           .
                           super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                           super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
                   uVar13);
      ptVar5 = args->first;
      *(Scope **)
       ((long)&ppVar4[pos0 * 0xf].first.
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               .
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
               super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl + uVar13) =
           (ptVar5->
           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
           ).
           super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
           .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
           super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
      pcVar9 = (ptVar5->
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               ).
               super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
               _M_head_impl._M_str;
      psVar3 = (size_t *)
               ((long)&ppVar4[pos0 * 0xf].first.
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       .
                       super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       .
                       super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                       ._M_head_impl._M_len + uVar13);
      *psVar3 = (ptVar5->
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                ).
                super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                ._M_head_impl._M_len;
      psVar3[1] = (size_t)pcVar9;
      pcVar9 = (ptVar5->
               super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               ).super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
               ._M_head_impl._M_str;
      psVar3 = (size_t *)
               ((long)&ppVar4[pos0 * 0xf].first.
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       .
                       super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                       ._M_head_impl._M_len + uVar13);
      *psVar3 = (ptVar5->
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                ).
                super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
                _M_head_impl._M_len;
      psVar3[1] = (size_t)pcVar9;
      ptVar6 = args->second;
      (&ppVar4[pos0 * 0xf].second.
        super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
        .
        super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
        .super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.super__Tuple_impl<3UL,_bool>)[uVar13]
      .super__Head_base<3UL,_bool,_false>._M_head_impl =
           (ptVar6->
           super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
           ).
           super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
           .super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.super__Tuple_impl<3UL,_bool>.
           super__Head_base<3UL,_bool,_false>._M_head_impl;
      *(SymbolIndex *)
       ((long)&ppVar4[pos0 * 0xf].second.
               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
               .
               super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
               .super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.
               super__Head_base<2UL,_slang::ast::SymbolIndex,_false>._M_head_impl + uVar13) =
           (ptVar6->
           super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
           ).
           super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
           .super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.
           super__Head_base<2UL,_slang::ast::SymbolIndex,_false>._M_head_impl;
      *(ScopedNameSyntax **)
       ((long)&ppVar4[pos0 * 0xf].second.
               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
               .
               super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
               .super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>._M_head_impl +
       uVar13) = (ptVar6->
                 super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                 ).
                 super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                 .super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>._M_head_impl
      ;
      *(SyntaxNode **)
       ((long)&ppVar4[pos0 * 0xf].second.
               super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
               .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl +
       uVar13) = (ptVar6->
                 super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                 ).super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl;
      pgVar1->m[uVar10].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar14 = pgVar1;
    }
    if (uVar8 != 0) break;
    pos0 = pos0 + lVar12 & arrays_->groups_size_mask;
    lVar12 = lVar12 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar10;
  __return_storage_ptr__->p = ppVar11;
  __return_storage_ptr__->pg = pgVar14;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }